

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall
flatbuffers::ts::TsGenerator::AddImport
          (TsGenerator *this,import_set *imports,string *import_name,string *fileName)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_f8 [8];
  ImportDefinition import;
  string *fileName_local;
  string *import_name_local;
  import_set *imports_local;
  TsGenerator *this_local;
  
  import.dependency = (Definition *)fileName;
  anon_unknown_10::ImportDefinition::ImportDefinition((ImportDefinition *)local_f8);
  std::__cxx11::string::operator=((string *)local_f8,(string *)import_name);
  std::operator+(&local_188,"import ",import_name);
  std::operator+(&local_168,&local_188," from \'");
  std::operator+(&local_148,&local_168,fileName);
  std::operator+(&local_128,&local_148,"\';");
  std::__cxx11::string::operator=
            ((string *)(import.name.field_2._M_local_buf + 8),(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::make_pair<std::__cxx11::string&,flatbuffers::(anonymous_namespace)::ImportDefinition&>
            (&local_278,import_name,(ImportDefinition *)local_f8);
  std::
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
            ((map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
              *)imports,&local_278);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  ::~pair(&local_278);
  anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)local_f8);
  return;
}

Assistant:

void AddImport(import_set &imports, std::string import_name,
                 std::string fileName) {
    ImportDefinition import;
    import.name = import_name;
    import.import_statement =
        "import " + import_name + " from '" + fileName + "';";
    imports.insert(std::make_pair(import_name, import));
  }